

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

int png_image_read_direct(png_voidp argument)

{
  png_imagep image_in;
  png_structrp png_ptr_00;
  png_const_inforp info_ptr_00;
  long lVar1;
  png_uint_32 pVar2;
  int iVar3;
  png_size_t pVar4;
  png_voidp pvVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  png_bytep local_d0;
  png_bytep row_2;
  png_uint_32 y;
  png_alloc_size_t row_bytes_1;
  png_voidp row_1;
  int result_1;
  png_voidp row;
  int result;
  char *ptr;
  ptrdiff_t row_bytes;
  png_voidp first_row;
  png_uint_32 info_format;
  png_uint_32 pStack_74;
  png_uint_16 le;
  int where;
  png_uint_32 filler;
  ushort local_68;
  png_color_16 c;
  png_fixed_point gtest;
  png_fixed_point input_gamma_default;
  int mode;
  png_fixed_point output_gamma;
  png_uint_32 change;
  png_uint_32 base_format;
  int passes;
  int do_local_background;
  int do_local_compose;
  int linear;
  png_uint_32 format;
  png_inforp info_ptr;
  png_structrp png_ptr;
  png_imagep image;
  png_image_read_control *display;
  png_voidp argument_local;
  
  image_in = *argument;
  png_ptr_00 = image_in->opaque->png_ptr;
  info_ptr_00 = image_in->opaque->info_ptr;
  do_local_compose = image_in->format;
  bVar6 = (do_local_compose & 4U) != 0;
  bVar7 = false;
  base_format = 0;
  change = 0;
  png_set_expand(png_ptr_00);
  pVar2 = png_image_format(png_ptr_00);
  mode = do_local_compose ^ pVar2 & 0xfffffff7;
  if ((mode & 2U) != 0) {
    if ((do_local_compose & 2U) == 0) {
      base_format = (png_uint_32)((pVar2 & 1) != 0);
      png_set_rgb_to_gray_fixed(png_ptr_00,1,-1,-1);
    }
    else {
      png_set_gray_to_rgb(png_ptr_00);
    }
    mode = mode & 0xfffffffd;
  }
  if (((pVar2 & 4) == 0) || ((image_in->flags & 4) != 0)) {
    c.blue = 0xffff;
    c.gray = 0xffff;
  }
  else {
    c.blue = 0x86a0;
    c.gray = 1;
  }
  png_set_alpha_mode_fixed(png_ptr_00,0,c._6_4_);
  if (bVar6) {
    gtest = (png_fixed_point)((pVar2 & 1) != 0);
    input_gamma_default = 100000;
  }
  else {
    gtest = 0;
    input_gamma_default = -1;
  }
  if (base_format != 0) {
    iVar3 = png_muldiv((png_fixed_point_p)&c.red,input_gamma_default,(png_ptr_00->colorspace).gamma,
                       100000);
    if ((iVar3 == 0) || (iVar3 = png_gamma_significant(c._2_4_), iVar3 != 0)) {
      if (gtest == 1) {
        base_format = 2;
        gtest = 0;
      }
    }
    else {
      base_format = 0;
    }
  }
  if ((mode & 4U) != 0) {
    if (bVar6) {
      png_set_expand_16(png_ptr_00);
    }
    else {
      png_set_scale_16(png_ptr_00);
    }
    mode = mode & 0xfffffffb;
  }
  if ((mode & 1U) != 0) {
    if ((pVar2 & 1) == 0) {
      if (bVar6) {
        pStack_74 = 0xffff;
      }
      else {
        pStack_74 = 0xff;
      }
      bVar8 = (do_local_compose & 0x20U) == 0;
      if (!bVar8) {
        mode = mode & 0xffffffdf;
      }
      info_format = (png_uint_32)bVar8;
      png_set_add_alpha(png_ptr_00,pStack_74,info_format);
    }
    else if (base_format == 0) {
      if (bVar6) {
        png_set_strip_alpha(png_ptr_00);
      }
      else {
        bVar7 = *(long *)((long)argument + 0x20) == 0;
        if (bVar7) {
          gtest = 2;
        }
        else {
          where._2_1_ = 0;
          filler._0_2_ = (ushort)**(byte **)((long)argument + 0x20);
          filler._2_2_ = (ushort)*(byte *)(*(long *)((long)argument + 0x20) + 1);
          local_68 = (ushort)*(byte *)(*(long *)((long)argument + 0x20) + 2);
          c._0_2_ = ZEXT12(*(byte *)(*(long *)((long)argument + 0x20) + 1));
          png_set_background_fixed(png_ptr_00,(png_const_color_16p)((long)&where + 2),1,0,0);
        }
      }
    }
    else {
      base_format = 2;
    }
    mode = mode & 0xfffffffe;
  }
  png_set_alpha_mode_fixed(png_ptr_00,gtest,input_gamma_default);
  if ((mode & 0x10U) != 0) {
    if ((do_local_compose & 2U) == 0) {
      do_local_compose = do_local_compose & 0xffffffef;
    }
    else {
      png_set_bgr(png_ptr_00);
    }
    mode = mode & 0xffffffef;
  }
  if ((mode & 0x20U) != 0) {
    if ((do_local_compose & 1U) == 0) {
      do_local_compose = do_local_compose & 0xffffffdf;
    }
    else if (base_format != 2) {
      png_set_swap_alpha(png_ptr_00);
    }
    mode = mode & 0xffffffdf;
  }
  if (bVar6) {
    png_set_swap(png_ptr_00);
  }
  if (mode != 0) {
    png_error(png_ptr_00,"png_read_image: unsupported transformation");
  }
  png_image_skip_unused_chunks(png_ptr_00);
  if ((!bVar7) && (base_format != 2)) {
    change = png_set_interlace_handling(png_ptr_00);
  }
  png_read_update_info(png_ptr_00,info_ptr_00);
  first_row._0_4_ = 0;
  if ((info_ptr_00->color_type & 2) != 0) {
    first_row._0_4_ = 2;
  }
  if ((info_ptr_00->color_type & 4) == 0) {
    if (bVar7) {
      png_error(png_ptr_00,"png_image_read: alpha channel lost");
    }
  }
  else if ((!bVar7) && ((base_format != 2 || ((do_local_compose & 1U) != 0)))) {
    first_row._0_4_ = (uint)first_row | 1;
  }
  if (info_ptr_00->bit_depth == '\x10') {
    first_row._0_4_ = (uint)first_row | 4;
  }
  if ((png_ptr_00->transformations & 1) != 0) {
    first_row._0_4_ = (uint)first_row | 0x10;
  }
  if ((base_format == 2) && ((do_local_compose & 0x20U) != 0)) {
    first_row._0_4_ = (uint)first_row | 0x20;
  }
  if (((png_ptr_00->transformations & 0x20000) != 0) ||
     (((png_ptr_00->transformations & 0x1000000) != 0 && ((png_ptr_00->flags & 0x80) == 0)))) {
    if (base_format == 2) {
      png_error(png_ptr_00,"unexpected alpha swap transformation");
    }
    first_row._0_4_ = (uint)first_row | 0x20;
  }
  if ((uint)first_row == do_local_compose) {
    row_bytes = *(long *)((long)argument + 8);
    ptr = (char *)(long)*(int *)((long)argument + 0x10);
    if (bVar6) {
      ptr = (char *)((long)ptr << 1);
    }
    if ((long)ptr < 0) {
      row_bytes = (ulong)(image_in->height - 1) * -(long)ptr + row_bytes;
    }
    *(ptrdiff_t *)((long)argument + 0x30) = row_bytes;
    *(char **)((long)argument + 0x38) = ptr;
    if (bVar7) {
      pVar4 = png_get_rowbytes(png_ptr_00,info_ptr_00);
      pvVar5 = png_malloc(png_ptr_00,pVar4);
      *(png_voidp *)((long)argument + 0x28) = pvVar5;
      argument_local._4_4_ = png_safe_execute(image_in,png_image_read_composite,argument);
      *(undefined8 *)((long)argument + 0x28) = 0;
      png_free(png_ptr_00,pvVar5);
    }
    else if (base_format == 2) {
      pVar4 = png_get_rowbytes(png_ptr_00,info_ptr_00);
      pvVar5 = png_malloc(png_ptr_00,pVar4);
      *(png_voidp *)((long)argument + 0x28) = pvVar5;
      argument_local._4_4_ = png_safe_execute(image_in,png_image_read_background,argument);
      *(undefined8 *)((long)argument + 0x28) = 0;
      png_free(png_ptr_00,pvVar5);
    }
    else {
      lVar1 = *(long *)((long)argument + 0x38);
      while (change = change - 1, -1 < (int)change) {
        local_d0 = *(png_bytep *)((long)argument + 0x30);
        for (row_2._4_4_ = image_in->height; row_2._4_4_ != 0; row_2._4_4_ = row_2._4_4_ - 1) {
          png_read_row(png_ptr_00,local_d0,(png_bytep)0x0);
          local_d0 = local_d0 + lVar1;
        }
      }
      argument_local._4_4_ = 1;
    }
    return argument_local._4_4_;
  }
  png_error(png_ptr_00,"png_read_image: invalid transformations");
}

Assistant:

static int
png_image_read_direct(png_voidp argument)
{
   png_image_read_control *display = png_voidcast(png_image_read_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;
   png_inforp info_ptr = image->opaque->info_ptr;

   png_uint_32 format = image->format;
   int linear = (format & PNG_FORMAT_FLAG_LINEAR) != 0;
   int do_local_compose = 0;
   int do_local_background = 0; /* to avoid double gamma correction bug */
   int passes = 0;

   /* Add transforms to ensure the correct output format is produced then check
    * that the required implementation support is there.  Always expand; always
    * need 8 bits minimum, no palette and expanded tRNS.
    */
   png_set_expand(png_ptr);

   /* Now check the format to see if it was modified. */
   {
      png_uint_32 base_format = png_image_format(png_ptr) &
         ~PNG_FORMAT_FLAG_COLORMAP /* removed by png_set_expand */;
      png_uint_32 change = format ^ base_format;
      png_fixed_point output_gamma;
      int mode; /* alpha mode */

      /* Do this first so that we have a record if rgb to gray is happening. */
      if ((change & PNG_FORMAT_FLAG_COLOR) != 0)
      {
         /* gray<->color transformation required. */
         if ((format & PNG_FORMAT_FLAG_COLOR) != 0)
            png_set_gray_to_rgb(png_ptr);

         else
         {
            /* libpng can't do both rgb to gray and
             * background/pre-multiplication if there is also significant gamma
             * correction, because both operations require linear colors and
             * the code only supports one transform doing the gamma correction.
             * Handle this by doing the pre-multiplication or background
             * operation in this code, if necessary.
             *
             * TODO: fix this by rewriting pngrtran.c (!)
             *
             * For the moment (given that fixing this in pngrtran.c is an
             * enormous change) 'do_local_background' is used to indicate that
             * the problem exists.
             */
            if ((base_format & PNG_FORMAT_FLAG_ALPHA) != 0)
               do_local_background = 1/*maybe*/;

            png_set_rgb_to_gray_fixed(png_ptr, PNG_ERROR_ACTION_NONE,
                PNG_RGB_TO_GRAY_DEFAULT, PNG_RGB_TO_GRAY_DEFAULT);
         }

         change &= ~PNG_FORMAT_FLAG_COLOR;
      }

      /* Set the gamma appropriately, linear for 16-bit input, sRGB otherwise.
       */
      {
         png_fixed_point input_gamma_default;

         if ((base_format & PNG_FORMAT_FLAG_LINEAR) != 0 &&
             (image->flags & PNG_IMAGE_FLAG_16BIT_sRGB) == 0)
            input_gamma_default = PNG_GAMMA_LINEAR;
         else
            input_gamma_default = PNG_DEFAULT_sRGB;

         /* Call png_set_alpha_mode to set the default for the input gamma; the
          * output gamma is set by a second call below.
          */
         png_set_alpha_mode_fixed(png_ptr, PNG_ALPHA_PNG, input_gamma_default);
      }

      if (linear != 0)
      {
         /* If there *is* an alpha channel in the input it must be multiplied
          * out; use PNG_ALPHA_STANDARD, otherwise just use PNG_ALPHA_PNG.
          */
         if ((base_format & PNG_FORMAT_FLAG_ALPHA) != 0)
            mode = PNG_ALPHA_STANDARD; /* associated alpha */

         else
            mode = PNG_ALPHA_PNG;

         output_gamma = PNG_GAMMA_LINEAR;
      }

      else
      {
         mode = PNG_ALPHA_PNG;
         output_gamma = PNG_DEFAULT_sRGB;
      }

      /* If 'do_local_background' is set check for the presence of gamma
       * correction; this is part of the work-round for the libpng bug
       * described above.
       *
       * TODO: fix libpng and remove this.
       */
      if (do_local_background != 0)
      {
         png_fixed_point gtest;

         /* This is 'png_gamma_threshold' from pngrtran.c; the test used for
          * gamma correction, the screen gamma hasn't been set on png_struct
          * yet; it's set below.  png_struct::gamma, however, is set to the
          * final value.
          */
         if (png_muldiv(&gtest, output_gamma, png_ptr->colorspace.gamma,
             PNG_FP_1) != 0 && png_gamma_significant(gtest) == 0)
            do_local_background = 0;

         else if (mode == PNG_ALPHA_STANDARD)
         {
            do_local_background = 2/*required*/;
            mode = PNG_ALPHA_PNG; /* prevent libpng doing it */
         }

         /* else leave as 1 for the checks below */
      }

      /* If the bit-depth changes then handle that here. */
      if ((change & PNG_FORMAT_FLAG_LINEAR) != 0)
      {
         if (linear != 0 /*16-bit output*/)
            png_set_expand_16(png_ptr);

         else /* 8-bit output */
            png_set_scale_16(png_ptr);

         change &= ~PNG_FORMAT_FLAG_LINEAR;
      }

      /* Now the background/alpha channel changes. */
      if ((change & PNG_FORMAT_FLAG_ALPHA) != 0)
      {
         /* Removing an alpha channel requires composition for the 8-bit
          * formats; for the 16-bit it is already done, above, by the
          * pre-multiplication and the channel just needs to be stripped.
          */
         if ((base_format & PNG_FORMAT_FLAG_ALPHA) != 0)
         {
            /* If RGB->gray is happening the alpha channel must be left and the
             * operation completed locally.
             *
             * TODO: fix libpng and remove this.
             */
            if (do_local_background != 0)
               do_local_background = 2/*required*/;

            /* 16-bit output: just remove the channel */
            else if (linear != 0) /* compose on black (well, pre-multiply) */
               png_set_strip_alpha(png_ptr);

            /* 8-bit output: do an appropriate compose */
            else if (display->background != NULL)
            {
               png_color_16 c;

               c.index = 0; /*unused*/
               c.red = display->background->red;
               c.green = display->background->green;
               c.blue = display->background->blue;
               c.gray = display->background->green;

               /* This is always an 8-bit sRGB value, using the 'green' channel
                * for gray is much better than calculating the luminance here;
                * we can get off-by-one errors in that calculation relative to
                * the app expectations and that will show up in transparent
                * pixels.
                */
               png_set_background_fixed(png_ptr, &c,
                   PNG_BACKGROUND_GAMMA_SCREEN, 0/*need_expand*/,
                   0/*gamma: not used*/);
            }

            else /* compose on row: implemented below. */
            {
               do_local_compose = 1;
               /* This leaves the alpha channel in the output, so it has to be
                * removed by the code below.  Set the encoding to the 'OPTIMIZE'
                * one so the code only has to hack on the pixels that require
                * composition.
                */
               mode = PNG_ALPHA_OPTIMIZED;
            }
         }

         else /* output needs an alpha channel */
         {
            /* This is tricky because it happens before the swap operation has
             * been accomplished; however, the swap does *not* swap the added
             * alpha channel (weird API), so it must be added in the correct
             * place.
             */
            png_uint_32 filler; /* opaque filler */
            int where;

            if (linear != 0)
               filler = 65535;

            else
               filler = 255;

#ifdef PNG_FORMAT_AFIRST_SUPPORTED
            if ((format & PNG_FORMAT_FLAG_AFIRST) != 0)
            {
               where = PNG_FILLER_BEFORE;
               change &= ~PNG_FORMAT_FLAG_AFIRST;
            }

            else
#endif
            where = PNG_FILLER_AFTER;

            png_set_add_alpha(png_ptr, filler, where);
         }

         /* This stops the (irrelevant) call to swap_alpha below. */
         change &= ~PNG_FORMAT_FLAG_ALPHA;
      }

      /* Now set the alpha mode correctly; this is always done, even if there is
       * no alpha channel in either the input or the output because it correctly
       * sets the output gamma.
       */
      png_set_alpha_mode_fixed(png_ptr, mode, output_gamma);

#     ifdef PNG_FORMAT_BGR_SUPPORTED
         if ((change & PNG_FORMAT_FLAG_BGR) != 0)
         {
            /* Check only the output format; PNG is never BGR; don't do this if
             * the output is gray, but fix up the 'format' value in that case.
             */
            if ((format & PNG_FORMAT_FLAG_COLOR) != 0)
               png_set_bgr(png_ptr);

            else
               format &= ~PNG_FORMAT_FLAG_BGR;

            change &= ~PNG_FORMAT_FLAG_BGR;
         }
#     endif

#     ifdef PNG_FORMAT_AFIRST_SUPPORTED
         if ((change & PNG_FORMAT_FLAG_AFIRST) != 0)
         {
            /* Only relevant if there is an alpha channel - it's particularly
             * important to handle this correctly because do_local_compose may
             * be set above and then libpng will keep the alpha channel for this
             * code to remove.
             */
            if ((format & PNG_FORMAT_FLAG_ALPHA) != 0)
            {
               /* Disable this if doing a local background,
                * TODO: remove this when local background is no longer required.
                */
               if (do_local_background != 2)
                  png_set_swap_alpha(png_ptr);
            }

            else
               format &= ~PNG_FORMAT_FLAG_AFIRST;

            change &= ~PNG_FORMAT_FLAG_AFIRST;
         }
#     endif

      /* If the *output* is 16-bit then we need to check for a byte-swap on this
       * architecture.
       */
      if (linear != 0)
      {
         PNG_CONST png_uint_16 le = 0x0001;

         if ((*(png_const_bytep) & le) != 0)
            png_set_swap(png_ptr);
      }

      /* If change is not now 0 some transformation is missing - error out. */
      if (change != 0)
         png_error(png_ptr, "png_read_image: unsupported transformation");
   }

   PNG_SKIP_CHUNKS(png_ptr);

   /* Update the 'info' structure and make sure the result is as required; first
    * make sure to turn on the interlace handling if it will be required
    * (because it can't be turned on *after* the call to png_read_update_info!)
    *
    * TODO: remove the do_local_background fixup below.
    */
   if (do_local_compose == 0 && do_local_background != 2)
      passes = png_set_interlace_handling(png_ptr);

   png_read_update_info(png_ptr, info_ptr);

   {
      png_uint_32 info_format = 0;

      if ((info_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
         info_format |= PNG_FORMAT_FLAG_COLOR;

      if ((info_ptr->color_type & PNG_COLOR_MASK_ALPHA) != 0)
      {
         /* do_local_compose removes this channel below. */
         if (do_local_compose == 0)
         {
            /* do_local_background does the same if required. */
            if (do_local_background != 2 ||
               (format & PNG_FORMAT_FLAG_ALPHA) != 0)
               info_format |= PNG_FORMAT_FLAG_ALPHA;
         }
      }

      else if (do_local_compose != 0) /* internal error */
         png_error(png_ptr, "png_image_read: alpha channel lost");

      if (info_ptr->bit_depth == 16)
         info_format |= PNG_FORMAT_FLAG_LINEAR;

#ifdef PNG_FORMAT_BGR_SUPPORTED
      if ((png_ptr->transformations & PNG_BGR) != 0)
         info_format |= PNG_FORMAT_FLAG_BGR;
#endif

#ifdef PNG_FORMAT_AFIRST_SUPPORTED
         if (do_local_background == 2)
         {
            if ((format & PNG_FORMAT_FLAG_AFIRST) != 0)
               info_format |= PNG_FORMAT_FLAG_AFIRST;
         }

         if ((png_ptr->transformations & PNG_SWAP_ALPHA) != 0 ||
            ((png_ptr->transformations & PNG_ADD_ALPHA) != 0 &&
            (png_ptr->flags & PNG_FLAG_FILLER_AFTER) == 0))
         {
            if (do_local_background == 2)
               png_error(png_ptr, "unexpected alpha swap transformation");

            info_format |= PNG_FORMAT_FLAG_AFIRST;
         }
#     endif

      /* This is actually an internal error. */
      if (info_format != format)
         png_error(png_ptr, "png_read_image: invalid transformations");
   }

   /* Now read the rows.  If do_local_compose is set then it is necessary to use
    * a local row buffer.  The output will be GA, RGBA or BGRA and must be
    * converted to G, RGB or BGR as appropriate.  The 'local_row' member of the
    * display acts as a flag.
    */
   {
      png_voidp first_row = display->buffer;
      ptrdiff_t row_bytes = display->row_stride;

      if (linear != 0)
         row_bytes *= 2;

      /* The following expression is designed to work correctly whether it gives
       * a signed or an unsigned result.
       */
      if (row_bytes < 0)
      {
         char *ptr = png_voidcast(char*, first_row);
         ptr += (image->height-1) * (-row_bytes);
         first_row = png_voidcast(png_voidp, ptr);
      }

      display->first_row = first_row;
      display->row_bytes = row_bytes;
   }

   if (do_local_compose != 0)
   {
      int result;
      png_voidp row = png_malloc(png_ptr, png_get_rowbytes(png_ptr, info_ptr));

      display->local_row = row;
      result = png_safe_execute(image, png_image_read_composite, display);
      display->local_row = NULL;
      png_free(png_ptr, row);

      return result;
   }

   else if (do_local_background == 2)
   {
      int result;
      png_voidp row = png_malloc(png_ptr, png_get_rowbytes(png_ptr, info_ptr));

      display->local_row = row;
      result = png_safe_execute(image, png_image_read_background, display);
      display->local_row = NULL;
      png_free(png_ptr, row);

      return result;
   }

   else
   {
      png_alloc_size_t row_bytes = (png_alloc_size_t)display->row_bytes;

      while (--passes >= 0)
      {
         png_uint_32      y = image->height;
         png_bytep        row = png_voidcast(png_bytep, display->first_row);

         for (; y > 0; --y)
         {
            png_read_row(png_ptr, row, NULL);
            row += row_bytes;
         }
      }

      return 1;
   }
}